

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::RunInitialIPM(LpSolver *this,IPM *ipm)

{
  ipxint i;
  long *plVar1;
  int *piVar2;
  IPM *in_RSI;
  Control *in_RDI;
  double dVar3;
  Int m;
  Int switchiter;
  KKTSolverDiag kkt;
  Timer timer;
  Info *in_stack_00000318;
  Iterate *in_stack_00000320;
  KKTSolver *in_stack_00000328;
  IPM *in_stack_00000330;
  int in_stack_fffffffffffffeb0;
  ipxint in_stack_fffffffffffffeb4;
  Model *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ipxint local_f4;
  long local_f0 [2];
  Int local_e0;
  ipxint local_cc;
  KKTSolverDiag local_c8;
  IPM *local_10;
  
  local_10 = in_RSI;
  Timer::Timer((Timer *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  KKTSolverDiag::KKTSolverDiag
            ((KKTSolverDiag *)in_RDI,
             (Control *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  local_cc = Control::switchiter(in_RDI);
  if (local_cc < 0) {
    local_e0 = Model::rows((Model *)&in_RDI[1].field_0x1d0);
    local_f0[1] = 500;
    local_f0[0] = (long)(local_e0 / 0x14 + 10);
    plVar1 = std::min<long>(local_f0 + 1,local_f0);
    KKTSolverDiag::maxiter(&local_c8,(Int)*plVar1);
    i = Control::ipm_maxiter(in_RDI);
    IPM::maxiter(local_10,i);
  }
  else {
    local_f4 = Control::ipm_maxiter(in_RDI);
    piVar2 = std::min<int>(&local_cc,&local_f4);
    IPM::maxiter(local_10,*piVar2);
  }
  std::unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_>::get
            ((unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  IPM::Driver(in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_00000318);
  switch(*(undefined4 *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4) {
  case 1:
    *(undefined4 *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 = 0;
    break;
  case 7:
    in_stack_fffffffffffffeb0 = in_RDI[1].parameters_.super_ipx_parameters.max_centring_steps;
    in_stack_fffffffffffffeb4 = Control::ipm_maxiter(in_RDI);
    if (in_stack_fffffffffffffeb0 < in_stack_fffffffffffffeb4) {
      *(undefined4 *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 = 0;
    }
    break;
  case 8:
    *(undefined4 *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 = 0;
    break;
  case 9:
    *(undefined4 *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 = 0;
    *(undefined4 *)((long)&in_RDI[1].parameters_.super_ipx_parameters.logfile + 4) = 0;
  }
  dVar3 = Timer::Elapsed((Timer *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  in_RDI[1].parameters_.super_ipx_parameters.log_options =
       (HighsLogOptions *)(dVar3 + (double)in_RDI[1].parameters_.super_ipx_parameters.log_options);
  KKTSolverDiag::~KKTSolverDiag
            ((KKTSolverDiag *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return;
}

Assistant:

void LpSolver::RunInitialIPM(IPM& ipm) {
    Timer timer;
    KKTSolverDiag kkt(control_, model_);

    Int switchiter = control_.switchiter();
    if (switchiter < 0) {
        // Switch iteration not specified by user. Run as long as KKT solver
        // converges within min(500,10+m/20) iterations.
        Int m = model_.rows();
        kkt.maxiter(std::min(500l, (long) (10+m/20) ));
        ipm.maxiter(control_.ipm_maxiter());
    } else {
        ipm.maxiter(std::min(switchiter, control_.ipm_maxiter()));
    }
    ipm.Driver(&kkt, iterate_.get(), &info_);
    switch (info_.status_ipm) {
    case IPX_STATUS_optimal:
        // If the IPM reached its termination criterion in the initial
        // iterations (happens rarely), we still call the IPM again with basis
        // preconditioning. In exact arithmetic it would terminate without an
        // additional iteration. A starting basis is then available for
        // crossover.
        info_.status_ipm = IPX_STATUS_not_run;
        break;
    case IPX_STATUS_no_progress:
        info_.status_ipm = IPX_STATUS_not_run;
        break;
    case IPX_STATUS_failed:
        info_.status_ipm = IPX_STATUS_not_run;
        info_.errflag = 0;
        break;
    case IPX_STATUS_iter_limit:
        if (info_.iter < control_.ipm_maxiter()) // stopped at switchiter
            info_.status_ipm = IPX_STATUS_not_run;
    }
    info_.time_ipm1 += timer.Elapsed();
}